

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_model_component.cpp
# Opt level: O3

bool ON_ModelComponent::IsValidComponentName
               (ON_ComponentManifest *model_manfest,ON_ModelComponent *model_component,
               bool bPermitReferencePrefix,ON_wString *valid_name)

{
  Type TVar1;
  uchar auVar2 [8];
  bool bVar3;
  bool bVar4;
  ON_ComponentManifestItem *pOVar5;
  ON__UINT64 OVar6;
  wchar_t *pwVar7;
  wchar_t *base_name;
  ON_wString *src;
  ON_UUID OVar8;
  ON_UUID component_parent_id;
  ON_wString ref;
  ON_wString leaf;
  ON_wString parent;
  ON_wString original_name;
  uint in_stack_ffffffffffffff8c;
  ON_ComponentManifest local_68;
  ON_wString local_60;
  undefined4 local_54;
  ON_ComponentManifest *local_50;
  ON_wString local_48;
  ON_wString local_40;
  ON_ComponentManifest local_38;
  
  local_50 = model_manfest;
  ON_wString::operator=(valid_name,&ON_wString::EmptyString);
  TVar1 = model_component->m_component_type;
  component_parent_id._1_7_ = 0;
  component_parent_id.Data1._0_1_ = TVar1;
  src = &model_component->m_component_name;
  if ((model_component->m_set_status & 0x20) == 0) {
    src = &ON_wString::EmptyString;
  }
  ON_wString::ON_wString(&local_40,src);
  bVar3 = IsValidComponentName(&local_40);
  if (bVar3) {
    if (TVar1 < 0x12) {
      if ((0x28df0U >> (TVar1 & 0x1f) & 1) == 0) {
        if ((0x720eU >> (TVar1 & 0x1f) & 1) == 0) goto LAB_00533d48;
        goto LAB_00533c07;
      }
      pOVar5 = ON_ComponentManifest::ItemFromName(local_50,model_component);
      local_54 = (undefined4)CONCAT71((int7)((ulong)pOVar5 >> 8),1);
LAB_00533c1b:
      OVar6 = ON_ComponentManifestItem::ComponentRuntimeSerialNumber(pOVar5);
      bVar3 = true;
      if (OVar6 != model_component->m_runtime_serial_number) {
        bVar4 = ON_ComponentManifestItem::IsUnset(pOVar5);
        if (!bVar4) {
          bVar3 = ON_ComponentManifestItem::IsSystemComponent(pOVar5);
        }
      }
      if ((bVar3 & bPermitReferencePrefix) == 0) {
        ON_wString::ON_wString((ON_wString *)&local_68);
        ON_wString::ON_wString(&local_48);
        ON_wString::ON_wString(&local_60);
        pwVar7 = ON_wString::operator_cast_to_wchar_t_(&local_40);
        SplitName(pwVar7,(ON_wString *)&local_68,&local_48,&local_60);
        if (bVar3 != false) {
          bVar3 = ON_wString::IsEmpty((ON_wString *)&local_68);
          if (bVar3) {
            ON_wString::~ON_wString(&local_60);
            ON_wString::~ON_wString(&local_48);
            ON_wString::~ON_wString((ON_wString *)&local_68);
            goto LAB_00533c48;
          }
        }
        bVar3 = IsValidComponentName(&local_60);
        if (bVar3) {
          if ((char)local_54 == '\0') {
            pOVar5 = &ON_ComponentManifestItem::UnsetItem;
          }
          else {
            OVar8 = model_component->m_component_parent_id;
            pwVar7 = ON_wString::operator_cast_to_wchar_t_(&local_60);
            pOVar5 = ON_ComponentManifest::ItemFromName(local_50,TVar1,OVar8,pwVar7);
          }
          bVar3 = ON_ComponentManifestItem::IsUnset(pOVar5);
          if (!bVar3) {
            bVar3 = ON_ComponentManifestItem::IsSystemComponent(pOVar5);
            if (!bVar3) {
              TVar1 = model_component->m_component_type;
              auVar2 = *(uchar (*) [8])&model_component->m_component_parent_id;
              pwVar7 = *(wchar_t **)(model_component->m_component_parent_id).Data4;
              base_name = ON_wString::operator_cast_to_wchar_t_(&local_60);
              OVar8._1_7_ = 0;
              OVar8.Data1._0_1_ = TVar1;
              OVar8.Data4 = auVar2;
              ON_ComponentManifest::UnusedName
                        (&local_38,(Type)local_50,OVar8,pwVar7,base_name,(wchar_t *)0x0,0,
                         (uint *)((ulong)in_stack_ffffffffffffff8c << 0x20));
              ON_wString::operator=(valid_name,(ON_wString *)&local_38);
              ON_wString::~ON_wString((ON_wString *)&local_38);
              goto LAB_00533dcf;
            }
          }
          ON_wString::operator=(valid_name,&local_60);
        }
LAB_00533dcf:
        ON_wString::~ON_wString(&local_60);
        ON_wString::~ON_wString(&local_48);
        ON_wString::~ON_wString((ON_wString *)&local_68);
        goto LAB_00533ded;
      }
    }
    else {
LAB_00533d48:
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
                 ,0x807,"","Invalid component_type parameter.");
LAB_00533c07:
      if (!bPermitReferencePrefix) {
        pOVar5 = &ON_ComponentManifestItem::UnsetItem;
        local_54 = 0;
        goto LAB_00533c1b;
      }
    }
LAB_00533c48:
    bVar3 = true;
    ON_wString::operator=(valid_name,&local_40);
  }
  else {
LAB_00533ded:
    bVar3 = ON_wString::IsEmpty(valid_name);
    if (bVar3) {
      component_parent_id.Data4 = *(uchar (*) [8])&model_component->m_component_parent_id;
      ON_ComponentManifest::UnusedName
                (&local_68,(Type)local_50,component_parent_id,
                 *(wchar_t **)(model_component->m_component_parent_id).Data4,(wchar_t *)0x0,
                 (wchar_t *)0x0,0,(uint *)((ulong)in_stack_ffffffffffffff8c << 0x20));
      ON_wString::operator=(valid_name,(ON_wString *)&local_68);
      ON_wString::~ON_wString((ON_wString *)&local_68);
    }
    bVar3 = false;
  }
  ON_wString::~ON_wString(&local_40);
  return bVar3;
}

Assistant:

bool ON_ModelComponent::IsValidComponentName(
  const class ON_ComponentManifest&  model_manfest,
  const ON_ModelComponent& model_component,
  bool bPermitReferencePrefix,
  ON_wString& valid_name
)
{
  valid_name = ON_wString::EmptyString;
  const ON_ModelComponent::Type model_component_type = model_component.ComponentType();

  const ON_wString original_name = model_component.Name();

  bool rc = false;
  for (;;)
  {
    if (false == ON_ModelComponent::IsValidComponentName(original_name))
    {
      break;
    }

    const bool bUniqueNameRequired = ON_ModelComponent::UniqueNameRequired(model_component_type);
    if (bPermitReferencePrefix && false == bUniqueNameRequired)
    {
      rc = true;
      break;
    }

    const class ON_ComponentManifestItem& item
      = (bUniqueNameRequired)
      ? model_manfest.ItemFromName(&model_component)
      : ON_ComponentManifestItem::UnsetItem;

    const bool bItemFromNameIsOK
      =  (item.ComponentRuntimeSerialNumber() == model_component.RuntimeSerialNumber())
      || item.IsUnset()
      || item.IsSystemComponent()
      ;

    if ( bItemFromNameIsOK && bPermitReferencePrefix)
    {
      rc = true;
      break;
    }

    ON_wString ref;
    ON_wString parent;
    ON_wString leaf;
    ON_ModelComponent::SplitName(
      original_name,
      ref,
      parent,
      leaf
    );
    if (bItemFromNameIsOK && ref.IsEmpty())
    {
      rc = true;
      break;
    }

    if (false == ON_ModelComponent::IsValidComponentName(leaf))
      break;

    const class ON_ComponentManifestItem& leaf_item
      = (bUniqueNameRequired)
      ? model_manfest.ItemFromName(model_component_type,model_component.ParentId(),leaf)
      : ON_ComponentManifestItem::UnsetItem;

    if (leaf_item.IsUnset() || leaf_item.IsSystemComponent())
    {
      valid_name = leaf;
      break;
    }

    valid_name = model_manfest.UnusedName(
      model_component.ComponentType(),
      model_component.ParentId(),
      leaf,
      nullptr,
      nullptr,
      0,
      nullptr
    );

    break;
  }

  if (rc)
  {
    valid_name = original_name;
  }
  else if (valid_name.IsEmpty())
  {
    valid_name = model_manfest.UnusedName(
      model_component_type,
      model_component.ParentId(),
      nullptr,
      nullptr,
      nullptr,
      0,
      nullptr
    );
  }

  return rc;
}